

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_message.c
# Opt level: O1

IOTHUB_MESSAGE_HANDLE IoTHubMessage_Clone(IOTHUB_MESSAGE_HANDLE iotHubMessageHandle)

{
  int iVar1;
  IOTHUB_MESSAGE_HANDLE_DATA *handleData;
  LOGGER_LOG p_Var2;
  IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA_HANDLE pIVar3;
  STRING_HANDLE pSVar4;
  MAP_HANDLE pMVar5;
  BUFFER_HANDLE pBVar6;
  char *pcVar7;
  
  if (iotHubMessageHandle == (IOTHUB_MESSAGE_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return (IOTHUB_MESSAGE_HANDLE)0x0;
    }
    pcVar7 = "iotHubMessageHandle parameter cannot be NULL for IoTHubMessage_Clone";
    iVar1 = 0x14e;
LAB_00124510:
    (*p_Var2)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_message.c"
              ,"IoTHubMessage_Clone",iVar1,1,pcVar7);
    return (IOTHUB_MESSAGE_HANDLE)0x0;
  }
  handleData = (IOTHUB_MESSAGE_HANDLE_DATA *)malloc(0x90);
  if (handleData == (IOTHUB_MESSAGE_HANDLE_DATA *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return (IOTHUB_MESSAGE_HANDLE)0x0;
    }
    pcVar7 = "unable to malloc";
    iVar1 = 0x156;
    goto LAB_00124510;
  }
  memset(handleData,0,0x90);
  handleData->contentType = iotHubMessageHandle->contentType;
  handleData->is_security_message = iotHubMessageHandle->is_security_message;
  if ((iotHubMessageHandle->messageId == (char *)0x0) ||
     (iVar1 = mallocAndStrcpy_s(&handleData->messageId,iotHubMessageHandle->messageId), iVar1 == 0))
  {
    if ((iotHubMessageHandle->correlationId == (char *)0x0) ||
       (iVar1 = mallocAndStrcpy_s(&handleData->correlationId,iotHubMessageHandle->correlationId),
       iVar1 == 0)) {
      if ((iotHubMessageHandle->userDefinedContentType == (char *)0x0) ||
         (iVar1 = mallocAndStrcpy_s(&handleData->userDefinedContentType,
                                    iotHubMessageHandle->userDefinedContentType), iVar1 == 0)) {
        if ((iotHubMessageHandle->contentEncoding == (char *)0x0) ||
           (iVar1 = mallocAndStrcpy_s(&handleData->contentEncoding,
                                      iotHubMessageHandle->contentEncoding), iVar1 == 0)) {
          if (iotHubMessageHandle->diagnosticData != (IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA *)0x0)
          {
            pIVar3 = CloneDiagnosticPropertyData(iotHubMessageHandle->diagnosticData);
            handleData->diagnosticData = pIVar3;
            if (pIVar3 == (IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA_HANDLE)0x0) {
              p_Var2 = xlogging_get_log_function();
              if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_00124914;
              pcVar7 = "unable to copy CloneDiagnosticPropertyData";
              iVar1 = 0x178;
              goto LAB_00124909;
            }
          }
          if ((iotHubMessageHandle->outputName == (char *)0x0) ||
             (iVar1 = mallocAndStrcpy_s(&handleData->outputName,iotHubMessageHandle->outputName),
             iVar1 == 0)) {
            if ((iotHubMessageHandle->inputName == (char *)0x0) ||
               (iVar1 = mallocAndStrcpy_s(&handleData->inputName,iotHubMessageHandle->inputName),
               iVar1 == 0)) {
              if ((iotHubMessageHandle->creationTimeUtc == (char *)0x0) ||
                 (iVar1 = mallocAndStrcpy_s(&handleData->creationTimeUtc,
                                            iotHubMessageHandle->creationTimeUtc), iVar1 == 0)) {
                if ((iotHubMessageHandle->userId == (char *)0x0) ||
                   (iVar1 = mallocAndStrcpy_s(&handleData->userId,iotHubMessageHandle->userId),
                   iVar1 == 0)) {
                  if ((iotHubMessageHandle->connectionModuleId == (char *)0x0) ||
                     (iVar1 = mallocAndStrcpy_s(&handleData->connectionModuleId,
                                                iotHubMessageHandle->connectionModuleId), iVar1 == 0
                     )) {
                    if ((iotHubMessageHandle->connectionDeviceId == (char *)0x0) ||
                       (iVar1 = mallocAndStrcpy_s(&handleData->connectionDeviceId,
                                                  iotHubMessageHandle->connectionDeviceId),
                       iVar1 == 0)) {
                      if ((iotHubMessageHandle->componentName == (char *)0x0) ||
                         (iVar1 = mallocAndStrcpy_s(&handleData->componentName,
                                                    iotHubMessageHandle->componentName), iVar1 == 0)
                         ) {
                        if (iotHubMessageHandle->contentType == IOTHUBMESSAGE_BYTEARRAY) {
                          pBVar6 = BUFFER_clone((iotHubMessageHandle->value).byteArray);
                          (handleData->value).byteArray = pBVar6;
                          if (pBVar6 == (BUFFER_HANDLE)0x0) {
                            p_Var2 = xlogging_get_log_function();
                            if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_00124914;
                            pcVar7 = "unable to BUFFER_clone";
                            iVar1 = 0x1aa;
                          }
                          else {
                            pMVar5 = Map_Clone(iotHubMessageHandle->properties);
                            handleData->properties = pMVar5;
                            if (pMVar5 != (MAP_HANDLE)0x0) {
                              return handleData;
                            }
                            p_Var2 = xlogging_get_log_function();
                            if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_00124914;
                            pcVar7 = "unable to Map_Clone";
                            iVar1 = 0x1b0;
                          }
                        }
                        else {
                          pSVar4 = STRING_clone((STRING_HANDLE)
                                                (iotHubMessageHandle->value).byteArray);
                          (handleData->value).string = pSVar4;
                          if (pSVar4 == (STRING_HANDLE)0x0) {
                            p_Var2 = xlogging_get_log_function();
                            if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_00124914;
                            pcVar7 = "failed to STRING_clone";
                            iVar1 = 0x1b9;
                          }
                          else {
                            pMVar5 = Map_Clone(iotHubMessageHandle->properties);
                            handleData->properties = pMVar5;
                            if (pMVar5 != (MAP_HANDLE)0x0) {
                              return handleData;
                            }
                            p_Var2 = xlogging_get_log_function();
                            if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_00124914;
                            pcVar7 = "unable to Map_Clone";
                            iVar1 = 0x1bf;
                          }
                        }
                      }
                      else {
                        p_Var2 = xlogging_get_log_function();
                        if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_00124914;
                        pcVar7 = "unable to copy componentName";
                        iVar1 = 0x1a2;
                      }
                    }
                    else {
                      p_Var2 = xlogging_get_log_function();
                      if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_00124914;
                      pcVar7 = "unable to copy inputName";
                      iVar1 = 0x19c;
                    }
                  }
                  else {
                    p_Var2 = xlogging_get_log_function();
                    if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_00124914;
                    pcVar7 = "unable to copy inputName";
                    iVar1 = 0x196;
                  }
                }
                else {
                  p_Var2 = xlogging_get_log_function();
                  if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_00124914;
                  pcVar7 = "unable to copy userId";
                  iVar1 = 400;
                }
              }
              else {
                p_Var2 = xlogging_get_log_function();
                if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_00124914;
                pcVar7 = "unable to copy creationTimeUtc";
                iVar1 = 0x18a;
              }
            }
            else {
              p_Var2 = xlogging_get_log_function();
              if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_00124914;
              pcVar7 = "unable to copy inputName";
              iVar1 = 0x184;
            }
          }
          else {
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_00124914;
            pcVar7 = "unable to copy outputName";
            iVar1 = 0x17e;
          }
        }
        else {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_00124914;
          pcVar7 = "unable to copy contentEncoding";
          iVar1 = 0x172;
        }
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_00124914;
        pcVar7 = "unable to copy contentType";
        iVar1 = 0x16c;
      }
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_00124914;
      pcVar7 = "unable to Copy correlationId";
      iVar1 = 0x166;
    }
  }
  else {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_00124914;
    pcVar7 = "unable to Copy messageId";
    iVar1 = 0x160;
  }
LAB_00124909:
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_message.c"
            ,"IoTHubMessage_Clone",iVar1,1,pcVar7);
LAB_00124914:
  DestroyMessageData(handleData);
  return (IOTHUB_MESSAGE_HANDLE)0x0;
}

Assistant:

IOTHUB_MESSAGE_HANDLE IoTHubMessage_Clone(IOTHUB_MESSAGE_HANDLE iotHubMessageHandle)
{
    IOTHUB_MESSAGE_HANDLE_DATA* result;
    const IOTHUB_MESSAGE_HANDLE_DATA* source = (const IOTHUB_MESSAGE_HANDLE_DATA*)iotHubMessageHandle;
    if (source == NULL)
    {
        result = NULL;
        LogError("iotHubMessageHandle parameter cannot be NULL for IoTHubMessage_Clone");
    }
    else
    {
        result = (IOTHUB_MESSAGE_HANDLE_DATA*)malloc(sizeof(IOTHUB_MESSAGE_HANDLE_DATA));
        if (result == NULL)
        {
            /*do nothing and return as is*/
            LogError("unable to malloc");
        }
        else
        {
            memset(result, 0, sizeof(*result));
            result->contentType = source->contentType;
            result->is_security_message = source->is_security_message;

            if (source->messageId != NULL && mallocAndStrcpy_s(&result->messageId, source->messageId) != 0)
            {
                LogError("unable to Copy messageId");
                DestroyMessageData(result);
                result = NULL;
            }
            else if (source->correlationId != NULL && mallocAndStrcpy_s(&result->correlationId, source->correlationId) != 0)
            {
                LogError("unable to Copy correlationId");
                DestroyMessageData(result);
                result = NULL;
            }
            else if (source->userDefinedContentType != NULL && mallocAndStrcpy_s(&result->userDefinedContentType, source->userDefinedContentType) != 0)
            {
                LogError("unable to copy contentType");
                DestroyMessageData(result);
                result = NULL;
            }
            else if (source->contentEncoding != NULL && mallocAndStrcpy_s(&result->contentEncoding, source->contentEncoding) != 0)
            {
                LogError("unable to copy contentEncoding");
                DestroyMessageData(result);
                result = NULL;
            }
            else if (source->diagnosticData != NULL && (result->diagnosticData = CloneDiagnosticPropertyData(source->diagnosticData)) == NULL)
            {
                LogError("unable to copy CloneDiagnosticPropertyData");
                DestroyMessageData(result);
                result = NULL;
            }
            else if (source->outputName != NULL && mallocAndStrcpy_s(&result->outputName, source->outputName) != 0)
            {
                LogError("unable to copy outputName");
                DestroyMessageData(result);
                result = NULL;
            }
            else if (source->inputName != NULL && mallocAndStrcpy_s(&result->inputName, source->inputName) != 0)
            {
                LogError("unable to copy inputName");
                DestroyMessageData(result);
                result = NULL;
            }
            else if (source->creationTimeUtc != NULL && mallocAndStrcpy_s(&result->creationTimeUtc, source->creationTimeUtc) != 0)
            {
                LogError("unable to copy creationTimeUtc");
                DestroyMessageData(result);
                result = NULL;
            }
            else if (source->userId != NULL && mallocAndStrcpy_s(&result->userId, source->userId) != 0)
            {
                LogError("unable to copy userId");
                DestroyMessageData(result);
                result = NULL;
            }
            else if (source->connectionModuleId != NULL && mallocAndStrcpy_s(&result->connectionModuleId, source->connectionModuleId) != 0)
            {
                LogError("unable to copy inputName");
                DestroyMessageData(result);
                result = NULL;
            }
            else if (source->connectionDeviceId != NULL && mallocAndStrcpy_s(&result->connectionDeviceId, source->connectionDeviceId) != 0)
            {
                LogError("unable to copy inputName");
                DestroyMessageData(result);
                result = NULL;
            }
            else if (source->componentName != NULL && mallocAndStrcpy_s(&result->componentName, source->componentName) != 0)
            {
                LogError("unable to copy componentName");
                DestroyMessageData(result);
                result = NULL;
            }
            else if (source->contentType == IOTHUBMESSAGE_BYTEARRAY)
            {
                if ((result->value.byteArray = BUFFER_clone(source->value.byteArray)) == NULL)
                {
                    LogError("unable to BUFFER_clone");
                    DestroyMessageData(result);
                    result = NULL;
                }
                else if ((result->properties = Map_Clone(source->properties)) == NULL)
                {
                    LogError("unable to Map_Clone");
                    DestroyMessageData(result);
                    result = NULL;
                }
            }
            else /*can only be STRING*/
            {
                if ((result->value.string = STRING_clone(source->value.string)) == NULL)
                {
                    LogError("failed to STRING_clone");
                    DestroyMessageData(result);
                    result = NULL;
                }
                else if ((result->properties = Map_Clone(source->properties)) == NULL)
                {
                    LogError("unable to Map_Clone");
                    DestroyMessageData(result);
                    result = NULL;
                }
            }
        }
    }
    return result;
}